

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graphics.cpp
# Opt level: O3

void __thiscall piksel::Graphics::_rect(Graphics *this,float a,float b,float c,float d)

{
  stack<piksel::State,_std::deque<piksel::State,_std::allocator<piksel::State>_>_> *psVar1;
  vector<piksel::ShaderRelevantState,std::allocator<piksel::ShaderRelevantState>> *this_00;
  iterator __position;
  _Elt_pointer pSVar2;
  float fVar3;
  float fVar4;
  
  push(this);
  psVar1 = this->stateStack;
  pSVar2 = (psVar1->c).super__Deque_base<piksel::State,_std::allocator<piksel::State>_>._M_impl.
           super__Deque_impl_data._M_finish._M_cur;
  if (pSVar2 == (psVar1->c).super__Deque_base<piksel::State,_std::allocator<piksel::State>_>._M_impl
                .super__Deque_impl_data._M_finish._M_first) {
    pSVar2 = (psVar1->c).super__Deque_base<piksel::State,_std::allocator<piksel::State>_>._M_impl.
             super__Deque_impl_data._M_finish._M_node[-1] + 2;
  }
  switch(pSVar2[-1].shaderIrrelevantState.rectMode) {
  case CENTER:
    a = a - c * 0.5;
    b = b - d * 0.5;
    goto LAB_0014c6c1;
  case CORNER:
LAB_0014c6c1:
    translate(this,a,b);
    break;
  case CORNERS:
    fVar3 = a;
    if (a <= c) {
      fVar3 = c;
      c = a;
    }
    fVar4 = b;
    if (b <= d) {
      fVar4 = d;
      d = b;
    }
    translate(this,c,d);
    c = fVar3 - c;
    d = fVar4 - d;
    break;
  case RADIUS:
    translate(this,a - c,b - d);
    c = c + c;
    d = d + d;
    break;
  default:
    goto switchD_0014c5db_default;
  }
  scale(this,c,d);
switchD_0014c5db_default:
  this_00 = (vector<piksel::ShaderRelevantState,std::allocator<piksel::ShaderRelevantState>> *)
            this->shaderRelevantStateVector;
  __position._M_current = *(ShaderRelevantState **)(this_00 + 8);
  if (__position._M_current == *(ShaderRelevantState **)(this_00 + 0x10)) {
    std::vector<piksel::ShaderRelevantState,std::allocator<piksel::ShaderRelevantState>>::
    _M_realloc_insert<piksel::ShaderRelevantState_const&>
              (this_00,__position,&pSVar2[-1].shaderRelevantState);
  }
  else {
    memcpy(__position._M_current,pSVar2 + -1,0xb8);
    *(long *)(this_00 + 8) = *(long *)(this_00 + 8) + 0xb8;
  }
  pop(this);
  return;
}

Assistant:

void Graphics::_rect(float a, float b, float c, float d) {
    push();
    State& state = peek();
    switch(state.shaderIrrelevantState.rectMode) {
        case DrawMode::CENTER:
            translate(a - c / 2, b - d / 2);
            scale(c, d);
            break;
        case DrawMode::CORNER:
            translate(a, b);
            scale(c, d);
            break;
        case DrawMode::CORNERS:
            if (a > c) {
                std::swap(a, c);
            }
            if (b > d) {
                std::swap(b, d);
            }
            translate(a, b);
            scale(c - a, d - b);
            break;
        case DrawMode::RADIUS:
            translate(a - c, b - d);
            scale(c * 2, d * 2);
            break; 
    }
    shaderRelevantStateVector.push_back(state.shaderRelevantState);
    pop();
}